

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtIO.c
# Opt level: O0

newtRef NewtFgets(FILE *stream)

{
  _Bool _Var1;
  uint32_t len_00;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  newtRef nVar6;
  int len;
  int oldlen;
  int maxsize;
  char c;
  char *str;
  char buff [2048];
  newtRefArg local_20;
  newtRefVar result;
  FILE *stream_local;
  
  local_20 = 2;
  while( true ) {
    __s = fgets((char *)&str,0x800,(FILE *)stream);
    if (__s == (char *)0x0) {
      return local_20;
    }
    sVar5 = strlen(__s);
    len_00 = (uint32_t)sVar5;
    if (local_20 == 2) {
      local_20 = NewtMakeString2(__s,len_00,false);
      _Var1 = NewtRefIsNIL(local_20);
      if (_Var1) {
        nVar6 = NewtThrow0(-0xbc58);
        return nVar6;
      }
    }
    else {
      uVar2 = NewtStringLength(local_20);
      local_20 = NewtStrCat2(local_20,__s,(long)(int)len_00);
      uVar3 = NewtStringLength(local_20);
      if (uVar3 < uVar2 + len_00) {
        nVar6 = NewtThrow0(-0xbc58);
        return nVar6;
      }
    }
    if ((int)len_00 < 0x7ff) break;
    if (buff[0x7f6] == '\n') {
      return local_20;
    }
    if (buff[0x7f6] == '\r') {
      iVar4 = fgetc((FILE *)stream);
      if ((char)iVar4 != '\n') {
        ungetc((int)(char)iVar4,(FILE *)stream);
        return local_20;
      }
    }
  }
  return local_20;
}

Assistant:

newtRef NewtFgets(FILE * stream)
{
    newtRefVar  result = kNewtRefNIL;
    char	buff[NEWT_FGETS_BUFFSIZE];
    char *  str;
    char	c;
    int		maxsize;
    int		oldlen;
    int		len;
    
    maxsize = sizeof(buff) - 1;
    
    while ((str = fgets(buff, sizeof(buff), stream)) != NULL)
    {
        len = (int)strlen(str);
        
        if (result == kNewtRefNIL)
        {	// 文字列オブジェクト作成
            result = NewtMakeString2(str, len, false);
            
            if (NewtRefIsNIL(result))
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        else
        {	// 追加
            oldlen = NewtStringLength(result);
            result = NewtStrCat2(result, str, len);
            
            if (NewtStringLength(result) < oldlen + len)
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        
        if (len < maxsize)
            break;
        
        // 最後の文字をチェック
        c = buff[maxsize - 1];
        
        if (c == '\n')
            break;
        
        if (c == '\r')
        {
            // １文字先読み
            c = fgetc(stream);
            
            if (c != '\n')
            {	// CRLF でない（CR のみ）場合
                // 先読みした文字をストリームに戻す
                ungetc(c, stream);
                break;
            }
        }
    }
    
    return result;
}